

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O2

void CreatePropertyGeneratorExpressions
               (cmStringRange entries,cmBacktraceRange backtraces,
               vector<cmGeneratorTarget::TargetPropertyEntry_*,_std::allocator<cmGeneratorTarget::TargetPropertyEntry_*>_>
               *items,bool evaluateForBuildsystem)

{
  auto_ptr<cmCompiledGeneratorExpression> aVar1;
  const_iterator backtrace;
  const_iterator cVar2;
  undefined3 in_register_00000089;
  cmCompiledGeneratorExpression *x;
  auto_ptr<cmCompiledGeneratorExpression> cge;
  cmGeneratorExpression local_70;
  cmGeneratorExpression ge;
  
  local_70.Backtrace.Bottom.Position.Tree._4_4_ =
       CONCAT31(in_register_00000089,evaluateForBuildsystem);
  backtrace = backtraces.Begin._M_current;
  local_70.Backtrace.Cur = (Entry *)items;
  for (cVar2 = entries.Begin._M_current; cVar2._M_current != entries.End._M_current._M_current;
      cVar2._M_current = cVar2._M_current + 1) {
    cmGeneratorExpression::cmGeneratorExpression(&ge,backtrace._M_current);
    cmGeneratorExpression::Parse(&local_70,(string *)&ge);
    cge.x_ = (cmCompiledGeneratorExpression *)local_70.Backtrace.Bottom.State;
    local_70.Backtrace.Bottom.State = (cmState *)0x0;
    cm::auto_ptr<cmCompiledGeneratorExpression>::~auto_ptr
              ((auto_ptr<cmCompiledGeneratorExpression> *)&local_70);
    aVar1 = cge;
    (cge.x_)->EvaluateForBuildsystem = SUB41(local_70.Backtrace.Bottom.Position.Tree._4_4_,0);
    local_70.Backtrace.Bottom.State = (cmState *)operator_new(0x10);
    cge.x_ = (cmCompiledGeneratorExpression *)0x0;
    local_70.Backtrace.Bottom.Position.Position = 0;
    *(cmCompiledGeneratorExpression **)
     &((local_70.Backtrace.Bottom.State)->PropertyDefinitions)._M_t._M_impl = aVar1.x_;
    *(cmLinkImplItem **)
     &((local_70.Backtrace.Bottom.State)->PropertyDefinitions)._M_t._M_impl.super__Rb_tree_header.
      _M_header = &cmGeneratorTarget::TargetPropertyEntry::NoLinkImplItem;
    std::
    vector<cmGeneratorTarget::TargetPropertyEntry*,std::allocator<cmGeneratorTarget::TargetPropertyEntry*>>
    ::emplace_back<cmGeneratorTarget::TargetPropertyEntry*>
              ((vector<cmGeneratorTarget::TargetPropertyEntry*,std::allocator<cmGeneratorTarget::TargetPropertyEntry*>>
                *)local_70.Backtrace.Cur,(TargetPropertyEntry **)&local_70);
    cm::auto_ptr<cmCompiledGeneratorExpression>::~auto_ptr
              ((auto_ptr<cmCompiledGeneratorExpression> *)
               &local_70.Backtrace.Bottom.Position.Position);
    cm::auto_ptr<cmCompiledGeneratorExpression>::~auto_ptr(&cge);
    cmGeneratorExpression::~cmGeneratorExpression(&ge);
    backtrace._M_current = backtrace._M_current + 1;
  }
  return;
}

Assistant:

void CreatePropertyGeneratorExpressions(
  cmStringRange entries, cmBacktraceRange backtraces,
  std::vector<cmGeneratorTarget::TargetPropertyEntry*>& items,
  bool evaluateForBuildsystem = false)
{
  std::vector<cmListFileBacktrace>::const_iterator btIt = backtraces.begin();
  for (std::vector<std::string>::const_iterator it = entries.begin();
       it != entries.end(); ++it, ++btIt) {
    cmGeneratorExpression ge(*btIt);
    CM_AUTO_PTR<cmCompiledGeneratorExpression> cge = ge.Parse(*it);
    cge->SetEvaluateForBuildsystem(evaluateForBuildsystem);
    items.push_back(new cmGeneratorTarget::TargetPropertyEntry(cge));
  }
}